

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_exception.hpp
# Opt level: O0

void __thiscall
duckdb::CatalogException::CatalogException<std::__cxx11::string>
          (CatalogException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  string *in_RDX;
  CatalogException *in_RDI;
  string local_58 [32];
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(local_58,(string *)in_RDX);
  Exception::ConstructMessage<std::__cxx11::string>(in_RDX,in_stack_ffffffffffffffe0);
  duckdb::CatalogException::CatalogException(in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

explicit CatalogException(const string &msg, ARGS... params) : CatalogException(ConstructMessage(msg, params...)) {
	}